

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

ExportedNames * __thiscall
Js::SourceTextModuleRecord::GetExportedNames
          (SourceTextModuleRecord *this,ExportModuleRecordList *exportStarSet)

{
  ExportedNames *pEVar1;
  IdentPtr pIVar2;
  code *pcVar3;
  SourceTextModuleRecord *pSVar4;
  bool bVar5;
  PropertyId PVar6;
  int iVar7;
  SList<int,_Memory::ArenaAllocator,_RealCount> *this_00;
  undefined4 *puVar8;
  Type *pTVar9;
  ExportModuleRecordList *this_01;
  undefined4 extraout_var;
  Type *pTVar11;
  ArenaAllocator *alloc;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  int local_64;
  Iterator local_60;
  SourceTextModuleRecord *local_50;
  SourceTextModuleRecord *moduleRecord;
  Iterator local_40;
  SourceTextModuleRecord *pSVar10;
  
  if (exportStarSet == (ExportModuleRecordList *)0x0) {
    pEVar1 = (this->exportedNames).ptr;
    if (pEVar1 != (ExportedNames *)0x0) {
      return pEVar1;
    }
    alloc = &((this->scriptContext).ptr)->generalAllocator;
    this_01 = (ExportModuleRecordList *)new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
    (this_01->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_01;
    (this_01->super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>).
    super_RealCount.count = 0;
    this_01->allocator = alloc;
  }
  else {
    alloc = &((this->scriptContext).ptr)->generalAllocator;
    this_01 = exportStarSet;
  }
  bVar5 = SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Has
                    (&this_01->
                      super_SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>,
                     &this->super_ModuleRecordBase);
  if (bVar5) {
    return (ExportedNames *)0x0;
  }
  local_40.list = (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)this;
  SList<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this_01,(ModuleRecordBase **)&local_40);
  moduleRecord = this;
  if ((this->localExportRecordList).ptr ==
      (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    if ((this->indirectExportRecordList).ptr ==
        (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      if ((this->starExportRecordList).ptr !=
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        this_00 = (SList<int,_Memory::ArenaAllocator,_RealCount> *)
                  new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
        (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
        (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0
        ;
        this_00->allocator = alloc;
        pSVar12 = (this->starExportRecordList).ptr;
        goto LAB_009e8563;
      }
      this_00 = (SList<int,_Memory::ArenaAllocator,_RealCount> *)0x0;
      goto LAB_009e87fd;
    }
    this_00 = (SList<int,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
    (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
    (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
    this_00->allocator = alloc;
    pSVar10 = (SourceTextModuleRecord *)(this->indirectExportRecordList).ptr;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_009e84c4:
    local_40.list =
         (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)pSVar10;
    local_40.current = (NodeBase *)pSVar10;
    while( true ) {
      if ((SourceTextModuleRecord *)local_40.current == (SourceTextModuleRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_009e8865;
        *puVar8 = 0;
      }
      pSVar10 = (SourceTextModuleRecord *)
                (((ModuleRecordBase *)&(local_40.current)->next)->super_FinalizableObject).
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if (pSVar10 == (SourceTextModuleRecord *)local_40.list) break;
      local_40.current = (NodeBase *)pSVar10;
      pTVar9 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_40);
      PVar6 = EnsurePropertyIdForIdentifier(moduleRecord,pTVar9->exportName);
      local_60.list =
           (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
           CONCAT44(local_60.list._4_4_,PVar6);
      SList<int,_Memory::ArenaAllocator,_RealCount>::Prepend(this_00,(int *)&local_60);
    }
  }
  else {
    this_00 = (SList<int,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
    (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
    (this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
    this_00->allocator = alloc;
    pSVar10 = (SourceTextModuleRecord *)(this->localExportRecordList).ptr;
    local_40.list =
         (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)pSVar10;
    local_40.current = (NodeBase *)pSVar10;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar10 == (SourceTextModuleRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_009e8865;
        *puVar8 = 0;
        pSVar10 = (SourceTextModuleRecord *)local_40.current;
      }
      pSVar10 = (SourceTextModuleRecord *)
                (pSVar10->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if (pSVar10 == (SourceTextModuleRecord *)local_40.list) break;
      local_40.current = (NodeBase *)pSVar10;
      pTVar9 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_40);
      PVar6 = EnsurePropertyIdForIdentifier(moduleRecord,pTVar9->exportName);
      local_60.list =
           (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
           CONCAT44(local_60.list._4_4_,PVar6);
      SList<int,_Memory::ArenaAllocator,_RealCount>::Prepend(this_00,(int *)&local_60);
      pSVar10 = (SourceTextModuleRecord *)local_40.current;
    }
    pSVar10 = (SourceTextModuleRecord *)(moduleRecord->indirectExportRecordList).ptr;
    if (pSVar10 != (SourceTextModuleRecord *)0x0) goto LAB_009e84c4;
  }
  pSVar12 = (moduleRecord->starExportRecordList).ptr;
  if (pSVar12 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
LAB_009e8563:
    local_60.list =
         &pSVar12->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
    local_60.current = (NodeBase *)pSVar12;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      if (pSVar12 == (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
LAB_009e8865:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        pSVar12 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_60.current;
      }
      pSVar12 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                (pSVar12->
                super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (pSVar12 ==
          (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_60.list)
      break;
      local_60.current = (NodeBase *)pSVar12;
      pTVar9 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_60);
      pIVar2 = pTVar9->moduleRequest;
      if (pIVar2 == (IdentPtr)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x1fe,"(exportEntry.moduleRequest != nullptr)",
                                    "exportEntry.moduleRequest != nullptr");
        if (!bVar5) goto LAB_009e8865;
        *puVar8 = 0;
      }
      local_50 = (SourceTextModuleRecord *)0x0;
      local_40.list =
           (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
           &pIVar2->field_0x22;
      bVar5 = JsUtil::
              BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t_const*>
                        ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(moduleRecord->childrenModuleSet).ptr,(char16_t **)&local_40,&local_50);
      if (bVar5) {
        if (local_50->wasParsed == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x202,"(moduleRecord->WasParsed())",
                                      "moduleRecord->WasParsed()");
          if (!bVar5) goto LAB_009e8865;
          *puVar8 = 0;
        }
        if (local_50->wasDeclarationInitialized == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x203,"(moduleRecord->WasDeclarationInitialized())",
                                      "moduleRecord->WasDeclarationInitialized()");
          if (!bVar5) goto LAB_009e8865;
          *puVar8 = 0;
        }
        if ((local_50->super_ModuleRecordBase).wasEvaluated == true) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x204,"(!moduleRecord->WasEvaluated())",
                                      "!moduleRecord->WasEvaluated()");
          if (!bVar5) goto LAB_009e8865;
          *puVar8 = 0;
        }
        iVar7 = (*(local_50->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(local_50,this_01);
        pSVar10 = (SourceTextModuleRecord *)CONCAT44(extraout_var,iVar7);
        pSVar12 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_60.current;
        pSVar4 = pSVar10;
        if (pSVar10 != (SourceTextModuleRecord *)0x0) {
          while( true ) {
            local_40.current = (NodeBase *)pSVar4;
            local_40.list =
                 (SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)pSVar10;
            if ((SourceTextModuleRecord *)local_40.current == (SourceTextModuleRecord *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                          ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_009e8865;
              *puVar8 = 0;
            }
            pSVar10 = (SourceTextModuleRecord *)
                      (((ModuleRecordBase *)&(local_40.current)->next)->super_FinalizableObject).
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
            pSVar12 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                      local_60.current;
            if (pSVar10 == (SourceTextModuleRecord *)local_40.list) break;
            local_40.current = (NodeBase *)pSVar10;
            pTVar11 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                ((Iterator *)&local_40);
            local_64 = *pTVar11;
            pSVar10 = (SourceTextModuleRecord *)local_40.list;
            pSVar4 = (SourceTextModuleRecord *)local_40.current;
            if ((local_64 != 0x6e) &&
               (bVar5 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Has
                                  (&this_00->super_SListBase<int,_Memory::ArenaAllocator,_RealCount>
                                   ,local_64), pSVar10 = (SourceTextModuleRecord *)local_40.list,
               pSVar4 = (SourceTextModuleRecord *)local_40.current, !bVar5)) {
              SList<int,_Memory::ArenaAllocator,_RealCount>::Prepend(this_00,&local_64);
              pSVar10 = (SourceTextModuleRecord *)local_40.list;
              pSVar4 = (SourceTextModuleRecord *)local_40.current;
            }
          }
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x214,"(false)",
                                    "dependent modules should have been initialized");
        if (!bVar5) goto LAB_009e8865;
        *puVar8 = 0;
        pSVar12 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                  local_60.current;
      }
    } while( true );
  }
LAB_009e87fd:
  if (exportStarSet == (ExportModuleRecordList *)0x0) {
    Memory::WriteBarrierPtr<SList<int,_Memory::ArenaAllocator,_RealCount>_>::WriteBarrierSet
              (&moduleRecord->exportedNames,this_00);
  }
  return this_00;
}

Assistant:

ExportedNames* SourceTextModuleRecord::GetExportedNames(ExportModuleRecordList* exportStarSet)
    {
        const bool isRootGetExportedNames = (exportStarSet == nullptr);

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames && exportedNames != nullptr)
        {
            return exportedNames;
        }

        ArenaAllocator* allocator = scriptContext->GeneralAllocator();

        if (exportStarSet == nullptr)
        {
            exportStarSet = Anew(allocator, ExportModuleRecordList, allocator);
        }
        if (exportStarSet->Has(this))
        {
            return nullptr;
        }
        exportStarSet->Prepend(this);

        ExportedNames* tempExportedNames = nullptr;
        if (this->localExportRecordList != nullptr)
        {
            tempExportedNames = Anew(allocator, ExportedNames, allocator);
            this->localExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportNameId);
            });
        }
        if (this->indirectExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->indirectExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportedNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                tempExportedNames->Prepend(exportedNameId);
            });
        }
        if (this->starExportRecordList != nullptr)
        {
            if (tempExportedNames == nullptr)
            {
                tempExportedNames = Anew(allocator, ExportedNames, allocator);
            }
            this->starExportRecordList->Map([=](ModuleImportOrExportEntry exportEntry) {
                Assert(exportEntry.moduleRequest != nullptr);
                SourceTextModuleRecord* moduleRecord = nullptr;
                if (this->childrenModuleSet->TryGetValue(exportEntry.moduleRequest->Psz(), &moduleRecord))
                {
                    Assert(moduleRecord->WasParsed());
                    Assert(moduleRecord->WasDeclarationInitialized()); // we should be half way during initialization
                    Assert(!moduleRecord->WasEvaluated());
                    ExportedNames* starExportedNames = moduleRecord->GetExportedNames(exportStarSet);
                    // We are not rejecting ambiguous resolution at this time.
                    if (starExportedNames != nullptr)
                    {
                        starExportedNames->Map([&](PropertyId propertyId) {
                            if (propertyId != PropertyIds::default_ && !tempExportedNames->Has(propertyId))
                            {
                                tempExportedNames->Prepend(propertyId);
                            }
                        });
                    }
                }
#if DBG
                else
                {
                    AssertMsg(false, "dependent modules should have been initialized");
                }
#endif
            });
        }

        // this->exportedNames only caches root "GetExportedNames(nullptr)"
        if (isRootGetExportedNames)
        {
            exportedNames = tempExportedNames;
        }

        return tempExportedNames;
    }